

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InteractionManager.cpp
# Opt level: O2

void __thiscall OpenMD::InteractionManager::InteractionManager(InteractionManager *this)

{
  _Rb_tree_header *p_Var1;
  __shared_ptr<OpenMD::Electrostatic,_(__gnu_cxx::_Lock_policy)2> _Stack_38;
  
  this->_vptr_InteractionManager = (_func_int **)&PTR__InteractionManager_002798e8;
  (this->typeMap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  p_Var1 = &(this->typeMap_)._M_t._M_impl.super__Rb_tree_header;
  (this->typeMap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  memset(&this->info_,0,0xb8);
  (this->typeMap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->typeMap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  this->initialized_ = false;
  (this->typeMap_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->interactions_).
  super__Vector_base<std::vector<std::set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>,_std::allocator<std::set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>_>_>,_std::allocator<std::vector<std::set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>,_std::allocator<std::set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->interactions_).
  super__Vector_base<std::vector<std::set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>,_std::allocator<std::set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>_>_>,_std::allocator<std::vector<std::set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>,_std::allocator<std::set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->interactions_).
  super__Vector_base<std::vector<std::set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>,_std::allocator<std::set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>_>_>,_std::allocator<std::vector<std::set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>,_std::allocator<std::set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->iHash_).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->iHash_).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->iHash_).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->sHash_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->sHash_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->sHash_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::make_shared<OpenMD::LJ>();
  std::__shared_ptr<OpenMD::LJ,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->lj_).super___shared_ptr<OpenMD::LJ,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<OpenMD::LJ,_(__gnu_cxx::_Lock_policy)2> *)&_Stack_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_38._M_refcount);
  std::make_shared<OpenMD::GB>();
  std::__shared_ptr<OpenMD::GB,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->gb_).super___shared_ptr<OpenMD::GB,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<OpenMD::GB,_(__gnu_cxx::_Lock_policy)2> *)&_Stack_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_38._M_refcount);
  std::make_shared<OpenMD::Sticky>();
  std::__shared_ptr<OpenMD::Sticky,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->sticky_).super___shared_ptr<OpenMD::Sticky,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<OpenMD::Sticky,_(__gnu_cxx::_Lock_policy)2> *)&_Stack_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_38._M_refcount);
  std::make_shared<OpenMD::Morse>();
  std::__shared_ptr<OpenMD::Morse,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->morse_).super___shared_ptr<OpenMD::Morse,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<OpenMD::Morse,_(__gnu_cxx::_Lock_policy)2> *)&_Stack_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_38._M_refcount);
  std::make_shared<OpenMD::RepulsivePower>();
  std::__shared_ptr<OpenMD::RepulsivePower,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->repulsivePower_).
              super___shared_ptr<OpenMD::RepulsivePower,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<OpenMD::RepulsivePower,_(__gnu_cxx::_Lock_policy)2> *)&_Stack_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_38._M_refcount);
  std::make_shared<OpenMD::Mie>();
  std::__shared_ptr<OpenMD::Mie,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->mie_).super___shared_ptr<OpenMD::Mie,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<OpenMD::Mie,_(__gnu_cxx::_Lock_policy)2> *)&_Stack_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_38._M_refcount);
  std::make_shared<OpenMD::EAM>();
  std::__shared_ptr<OpenMD::EAM,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->eam_).super___shared_ptr<OpenMD::EAM,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<OpenMD::EAM,_(__gnu_cxx::_Lock_policy)2> *)&_Stack_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_38._M_refcount);
  std::make_shared<OpenMD::SC>();
  std::__shared_ptr<OpenMD::SC,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->sc_).super___shared_ptr<OpenMD::SC,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<OpenMD::SC,_(__gnu_cxx::_Lock_policy)2> *)&_Stack_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_38._M_refcount);
  std::make_shared<OpenMD::Electrostatic>();
  std::__shared_ptr<OpenMD::Electrostatic,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->electrostatic_).
              super___shared_ptr<OpenMD::Electrostatic,_(__gnu_cxx::_Lock_policy)2>,&_Stack_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_38._M_refcount);
  std::make_shared<OpenMD::MAW>();
  std::__shared_ptr<OpenMD::MAW,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->maw_).super___shared_ptr<OpenMD::MAW,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<OpenMD::MAW,_(__gnu_cxx::_Lock_policy)2> *)&_Stack_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_38._M_refcount);
  std::make_shared<OpenMD::InversePowerSeries>();
  std::__shared_ptr<OpenMD::InversePowerSeries,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->inversePowerSeries_).
              super___shared_ptr<OpenMD::InversePowerSeries,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<OpenMD::InversePowerSeries,_(__gnu_cxx::_Lock_policy)2> *)&_Stack_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_38._M_refcount);
  return;
}

Assistant:

InteractionManager::InteractionManager() {
    initialized_ = false;

    lj_                 = std::make_shared<LJ>();
    gb_                 = std::make_shared<GB>();
    sticky_             = std::make_shared<Sticky>();
    morse_              = std::make_shared<Morse>();
    repulsivePower_     = std::make_shared<RepulsivePower>();
    mie_                = std::make_shared<Mie>();
    eam_                = std::make_shared<EAM>();
    sc_                 = std::make_shared<SC>();
    electrostatic_      = std::make_shared<Electrostatic>();
    maw_                = std::make_shared<MAW>();
    inversePowerSeries_ = std::make_shared<InversePowerSeries>();
  }